

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallString.h
# Opt level: O0

char * __thiscall llvm::SmallString<256U>::c_str(SmallString<256U> *this)

{
  pointer pcVar1;
  char local_11;
  SmallString<256U> *local_10;
  SmallString<256U> *this_local;
  
  local_11 = '\0';
  local_10 = this;
  SmallVectorTemplateBase<char,_true>::push_back
            ((SmallVectorTemplateBase<char,_true> *)this,&local_11);
  SmallVectorTemplateBase<char,_true>::pop_back((SmallVectorTemplateBase<char,_true> *)this);
  pcVar1 = SmallVectorTemplateCommon<char,_void>::data
                     ((SmallVectorTemplateCommon<char,_void> *)this);
  return pcVar1;
}

Assistant:

const char* c_str() {
    this->push_back(0);
    this->pop_back();
    return this->data();
  }